

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int uriPathTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int local_34;
  int failures;
  int parsed;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  local_34 = 0;
  iVar1 = xmlRegisterInputCallbacks(uripMatch,uripOpen,uripRead,uripClose);
  if (iVar1 < 0) {
    fprintf(_stderr,"failed to register HTTP handler\n");
    filename_local._4_4_ = -1;
  }
  else {
    for (urip_current = 0; urip_testURLs[urip_current] != (char *)0x0;
        urip_current = urip_current + 1) {
      urip_success = 1;
      iVar1 = urip_checkURL(urip_testURLs[urip_current]);
      if (urip_success == 1) {
        if (iVar1 != 1) {
          fprintf(_stderr,"failed the parsing test for %s",urip_testURLs[urip_current]);
          local_34 = local_34 + 1;
        }
      }
      else {
        fprintf(_stderr,"failed the URL passing test for %s",urip_testURLs[urip_current]);
        local_34 = local_34 + 1;
      }
      nb_tests = nb_tests + 1;
    }
    xmlPopInputCallbacks();
    filename_local._4_4_ = local_34;
  }
  return filename_local._4_4_;
}

Assistant:

static int
uriPathTest(const char *filename ATTRIBUTE_UNUSED,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
             int options ATTRIBUTE_UNUSED) {
    int parsed;
    int failures = 0;

    /*
     * register the new I/O handlers
     */
    if (xmlRegisterInputCallbacks(uripMatch, uripOpen, uripRead, uripClose) < 0)
    {
        fprintf(stderr, "failed to register HTTP handler\n");
	return(-1);
    }

    for (urip_current = 0;urip_testURLs[urip_current] != NULL;urip_current++) {
        urip_success = 1;
        parsed = urip_checkURL(urip_testURLs[urip_current]);
	if (urip_success != 1) {
	    fprintf(stderr, "failed the URL passing test for %s",
	            urip_testURLs[urip_current]);
	    failures++;
	} else if (parsed != 1) {
	    fprintf(stderr, "failed the parsing test for %s",
	            urip_testURLs[urip_current]);
	    failures++;
	}
	nb_tests++;
    }

    xmlPopInputCallbacks();
    return(failures);
}